

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *this,
          TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *param_1)

{
  undefined3 uVar1;
  ExpansionRule EVar2;
  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *param_1_local;
  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::CollectionInstance::ExpansionRule>::optional
            (&this->_attrib,&param_1->_attrib);
  uVar1 = *(undefined3 *)&param_1->field_0x229;
  EVar2 = param_1->_fallback;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x229 = uVar1;
  this->_fallback = EVar2;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }